

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_kmeth.c
# Opt level: O0

void EC_KEY_METHOD_set_init
               (EC_KEY_METHOD *meth,_func_int_EC_KEY_ptr *init,_func_void_EC_KEY_ptr *finish,
               _func_int_EC_KEY_ptr_EC_KEY_ptr *copy,_func_int_EC_KEY_ptr_EC_GROUP_ptr *set_group,
               _func_int_EC_KEY_ptr_BIGNUM_ptr *set_private,
               _func_int_EC_KEY_ptr_EC_POINT_ptr *set_public)

{
  _func_int_EC_KEY_ptr_BIGNUM_ptr *set_private_local;
  _func_int_EC_KEY_ptr_EC_GROUP_ptr *set_group_local;
  _func_int_EC_KEY_ptr_EC_KEY_ptr *copy_local;
  _func_void_EC_KEY_ptr *finish_local;
  _func_int_EC_KEY_ptr *init_local;
  EC_KEY_METHOD *meth_local;
  
  meth->init = init;
  meth->finish = finish;
  meth->copy = copy;
  meth->set_group = set_group;
  meth->set_private = set_private;
  meth->set_public = set_public;
  return;
}

Assistant:

void EC_KEY_METHOD_set_init(EC_KEY_METHOD *meth,
                            int (*init)(EC_KEY *key),
                            void (*finish)(EC_KEY *key),
                            int (*copy)(EC_KEY *dest, const EC_KEY *src),
                            int (*set_group)(EC_KEY *key, const EC_GROUP *grp),
                            int (*set_private)(EC_KEY *key,
                                               const BIGNUM *priv_key),
                            int (*set_public)(EC_KEY *key,
                                              const EC_POINT *pub_key))
{
    meth->init = init;
    meth->finish = finish;
    meth->copy = copy;
    meth->set_group = set_group;
    meth->set_private = set_private;
    meth->set_public = set_public;
}